

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O3

Shift dg::vr::RelationsAnalyzer::getShift(BinaryOperator *op,VectorSet<const_llvm::Value_*> *froms)

{
  char *pcVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  __normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
  _Var5;
  char cVar6;
  long lVar7;
  
  lVar7 = *(long *)(op + -0x20);
  cVar6 = *(char *)(*(long *)(op + -0x40) + 0x10);
  pcVar1 = (char *)(lVar7 + 0x10);
  if ((cVar6 == '\x10') == (*pcVar1 == '\x10')) {
    return UNKNOWN;
  }
  if (cVar6 == '\x10') {
    lVar7 = *(long *)(op + -0x40);
    cVar6 = *pcVar1;
  }
  if (cVar6 != ';') {
    return UNKNOWN;
  }
  _Var5 = std::
          __find_if<__gnu_cxx::__normal_iterator<llvm::Value_const*const*,std::vector<llvm::Value_const*,std::allocator<llvm::Value_const*>>>,__gnu_cxx::__ops::_Iter_equals_val<llvm::Value_const*const>>
                    ((froms->vec).
                     super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (froms->vec).
                     super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
  if (_Var5._M_current ==
      (froms->vec).super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    return UNKNOWN;
  }
  if (op[0x10] == (BinaryOperator)0x2a) {
    bVar3 = llvm::APInt::isAllOnes((APInt *)(lVar7 + 0x18));
    if (bVar3) {
      return INC;
    }
    uVar2 = *(uint *)(lVar7 + 0x20);
    if (uVar2 < 0x41) {
      if (*(long *)(lVar7 + 0x18) == 1) {
        return DEC;
      }
    }
    else {
      iVar4 = llvm::APInt::countLeadingZerosSlowCase();
      if (iVar4 == uVar2 - 1) {
        return DEC;
      }
    }
  }
  else if (op[0x10] == (BinaryOperator)0x28) {
    uVar2 = *(uint *)(lVar7 + 0x20);
    if (uVar2 < 0x41) {
      if (*(long *)(lVar7 + 0x18) == 1) {
        return INC;
      }
    }
    else {
      iVar4 = llvm::APInt::countLeadingZerosSlowCase();
      if (iVar4 == uVar2 - 1) {
        return INC;
      }
    }
    bVar3 = llvm::APInt::isAllOnes((APInt *)(lVar7 + 0x18));
    if (bVar3) {
      return DEC;
    }
  }
  return UNKNOWN;
}

Assistant:

RelationsAnalyzer::Shift
RelationsAnalyzer::getShift(const llvm::BinaryOperator *op,
                            const VectorSet<V> &froms) {
    if (llvm::isa<llvm::ConstantInt>(op->getOperand(0)) ==
        llvm::isa<llvm::ConstantInt>(op->getOperand(1)))
        return Shift::UNKNOWN;
    V param = nullptr;
    llvm::ConstantInt *c = nullptr;
    std::tie(param, c) = getParams(op);

    assert(param && c);
    auto load = llvm::dyn_cast<llvm::LoadInst>(param);
    if (!load || !froms.contains(load->getPointerOperand()))
        return Shift::UNKNOWN;

    auto opcode = op->getOpcode();
    if ((opcode == llvm::Instruction::Add && c->isOne()) ||
        (opcode == llvm::Instruction::Sub && c->isMinusOne())) {
        return Shift::INC;
    }
    if ((opcode == llvm::Instruction::Add && c->isMinusOne()) ||
        (opcode == llvm::Instruction::Sub && c->isOne())) {
        return Shift::DEC;
    }
    return Shift::UNKNOWN;
}